

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *tab_bar_00;
  ImGuiDockNode *pIVar1;
  ImU32 IVar2;
  ImGuiTabItem *pIVar3;
  ImGuiWindow *docked_window;
  ImGuiTabBar *tab_bar;
  
  tab_bar_00 = GImGui->CurrentTabBar;
  if ((tab_bar_00 == (ImGuiTabBar *)0x0) || ((tab_bar_00->Flags & 0x100000) != 0)) {
    docked_window = FindWindowByName(label);
    if ((docked_window != (ImGuiWindow *)0x0) &&
       (((docked_window->field_0x492 & 1) != 0 &&
        (pIVar1 = docked_window->DockNode, pIVar1 != (ImGuiDockNode *)0x0)))) {
      IVar2 = TabBarCalcTabID(pIVar1->TabBar,label,docked_window);
      TabBarRemoveTab(pIVar1->TabBar,IVar2);
      docked_window->field_0x492 = docked_window->field_0x492 | 4;
    }
  }
  else {
    IVar2 = TabBarCalcTabID(tab_bar_00,label,(ImGuiWindow *)0x0);
    pIVar3 = TabBarFindTabByID(tab_bar_00,IVar2);
    if (pIVar3 != (ImGuiTabItem *)0x0) {
      pIVar3->WantClose = true;
    }
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label, NULL);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
    else if (ImGuiWindow* window = FindWindowByName(label))
    {
        if (window->DockIsActive)
            if (ImGuiDockNode* node = window->DockNode)
            {
                ImGuiID tab_id = TabBarCalcTabID(node->TabBar, label, window);
                TabBarRemoveTab(node->TabBar, tab_id);
                window->DockTabWantClose = true;
            }
    }
}